

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

CubeFace tcu::selectCubeFace(Vec3 *coords)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = coords->m_data[0];
  fVar2 = coords->m_data[1];
  fVar3 = coords->m_data[2];
  uVar5 = -(uint)(-fVar1 <= fVar1);
  fVar6 = (float)(uVar5 & (uint)fVar1 | ~uVar5 & (uint)-fVar1);
  uVar5 = -(uint)(-fVar2 <= fVar2);
  fVar7 = (float)(uVar5 & (uint)fVar2 | ~uVar5 & (uint)-fVar2);
  uVar5 = -(uint)(-fVar3 <= fVar3);
  fVar8 = (float)(uVar5 & (uint)fVar3 | ~uVar5 & (uint)-fVar3);
  if ((fVar7 < fVar6) && (fVar8 < fVar6)) goto LAB_00a5e718;
  if ((fVar6 < fVar7) && (fVar8 < fVar7)) goto LAB_00a5e72e;
  if ((fVar8 <= fVar6) || (fVar8 <= fVar7)) {
    if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
      if ((fVar6 != fVar8) || (NAN(fVar6) || NAN(fVar8))) {
        if ((fVar7 != fVar8) || (fVar7 < fVar6)) goto LAB_00a5e718;
      }
      else if (fVar7 <= fVar8) goto LAB_00a5e75f;
LAB_00a5e72e:
      iVar4 = 2;
      fVar3 = fVar2;
      goto LAB_00a5e76a;
    }
    if (fVar8 <= fVar6) {
LAB_00a5e718:
      return (CubeFace)(0.0 <= fVar1);
    }
  }
LAB_00a5e75f:
  iVar4 = 4;
LAB_00a5e76a:
  return (iVar4 + 1) - (uint)(fVar3 < 0.0);
}

Assistant:

T						y			(void) const { DE_STATIC_ASSERT(Size >= 2); return m_data[1]; }